

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBreakCommand.h
# Opt level: O0

cmCommand * __thiscall cmBreakCommand::Clone(cmBreakCommand *this)

{
  cmCommand *this_00;
  cmBreakCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmBreakCommand((cmBreakCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmBreakCommand; }